

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O2

void cleanup_parse_ui_entry_renderer(void)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < renderer_count; lVar2 = lVar2 + 1) {
    mem_free(*(void **)((long)&renderers->symbols + lVar1));
    mem_free(*(void **)((long)&renderers->label_colors + lVar1));
    mem_free(*(void **)((long)&renderers->colors + lVar1));
    string_free(*(char **)((long)&renderers->comb_rend_nm + lVar1));
    string_free(*(char **)((long)&renderers->name + lVar1));
    lVar1 = lVar1 + 0x58;
  }
  mem_free(renderers);
  renderers = (renderer_info *)0x0;
  renderer_count = L'\0';
  renderer_allocated = L'\0';
  return;
}

Assistant:

static void cleanup_parse_ui_entry_renderer(void)
{
	int i;

	for (i = 0; i < renderer_count; i++) {
		mem_free(renderers[i].symbols);
		mem_free(renderers[i].label_colors);
		mem_free(renderers[i].colors);
		string_free(renderers[i].comb_rend_nm);
		string_free(renderers[i].name);
	}
	mem_free(renderers);
	renderers = NULL;
	renderer_count = 0;
	renderer_allocated = 0;
}